

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
BooleanInstance::op_isFalse
          (string *__return_storage_ptr__,BooleanInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  undefined8 *puVar1;
  char *pcVar2;
  bool bVar3;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = this->_value == false;
    pcVar2 = "false";
    if (bVar3) {
      pcVar2 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + ((ulong)bVar3 ^ 5));
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}